

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O1

bool __thiscall
pstore::command_line::
list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
::simple_value(list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
               *this,string *v)

{
  size_t *psVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  _Node *p_Var3;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> m;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_40;
  
  parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  operator()(&local_40,&this->parser_,v);
  bVar2 = local_40.valid_;
  if (local_40.valid_ == true) {
    __args = maybe<std::__cxx11::string,void>::
             value_impl<pstore::maybe<std::__cxx11::string,void>&,std::__cxx11::string>(&local_40);
    p_Var3 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
             _M_create_node<std::__cxx11::string_const&>
                       ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                        &this->values_,__args);
    std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
    psVar1 = &(this->values_).
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  if (local_40.valid_ == true) {
    local_40.valid_ = false;
    if (local_40.storage_.__align !=
        (anon_struct_8_0_00000001_for___align)((long)&local_40.storage_ + 0x10)) {
      operator_delete((void *)local_40.storage_.__align,local_40.storage_._16_8_ + 1);
    }
  }
  return bVar2;
}

Assistant:

bool list<T, Parser>::simple_value (std::string const & v) {
            if (maybe<T> m = parser_ (v)) {
                values_.push_back (m.value ());
                return true;
            }
            return false;
        }